

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O2

void __thiscall
cppjieba::DictTrie::CalculateWeight
          (DictTrie *this,
          vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *node_infos,double sum)

{
  pointer pDVar1;
  long lVar2;
  ulong uVar3;
  double dVar4;
  
  if (sum <= 0.0) {
    __assert_fail("sum > 0.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/DictTrie.hpp"
                  ,0xfc,"void cppjieba::DictTrie::CalculateWeight(vector<DictUnit> &, double) const"
                 );
  }
  lVar2 = 0x58;
  uVar3 = 0;
  while( true ) {
    pDVar1 = (node_infos->
             super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(node_infos->
                      super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pDVar1 >> 7) <= uVar3) {
      return;
    }
    dVar4 = *(double *)((long)(pDVar1->word).buffer_ + lVar2);
    if (dVar4 <= 0.0) break;
    dVar4 = log(dVar4 / sum);
    *(double *)((long)(pDVar1->word).buffer_ + lVar2) = dVar4;
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 0x80;
  }
  __assert_fail("node_info.weight > 0.0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/DictTrie.hpp"
                ,0xff,"void cppjieba::DictTrie::CalculateWeight(vector<DictUnit> &, double) const");
}

Assistant:

void CalculateWeight(vector<DictUnit>& node_infos, double sum) const {
    assert(sum > 0.0);
    for (size_t i = 0; i < node_infos.size(); i++) {
      DictUnit& node_info = node_infos[i];
      assert(node_info.weight > 0.0);
      node_info.weight = log(double(node_info.weight)/sum);
    }
  }